

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_multiuse_state(Curl_easy *data,int bundlestate)

{
  connectdata *conn;
  int bundlestate_local;
  Curl_easy *data_local;
  
  data->conn->bundle->multiuse = bundlestate;
  process_pending_handles(data->multi);
  return;
}

Assistant:

void Curl_multiuse_state(struct Curl_easy *data,
                         int bundlestate) /* use BUNDLE_* defines */
{
  struct connectdata *conn;
  DEBUGASSERT(data);
  DEBUGASSERT(data->multi);
  conn = data->conn;
  DEBUGASSERT(conn);
  DEBUGASSERT(conn->bundle);

  conn->bundle->multiuse = bundlestate;
  process_pending_handles(data->multi);
}